

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall aalcalc::debug_process_summaryfile(aalcalc *this,string *filename)

{
  FILE *__stream;
  OASIS_FLOAT OVar1;
  bool bVar2;
  char *__filename;
  undefined8 uVar3;
  mapped_type *pmVar4;
  uint *puVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  iterator p_iter;
  sampleslevelRec sr;
  int j;
  summarySampleslevelHeader sh;
  int summary_set;
  int stream_type;
  size_t i;
  FILE *pFStack_20;
  int summarycalcstream_type;
  FILE *fin;
  string *filename_local;
  aalcalc *this_local;
  
  fin = (FILE *)filename;
  filename_local = (string *)this;
  __filename = (char *)std::__cxx11::string::c_str();
  pFStack_20 = fopen(__filename,"rb");
  __stream = _stderr;
  if (pFStack_20 == (FILE *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"FATAL:%s: cannot open %s\n","debug_process_summaryfile",uVar3);
    exit(1);
  }
  i._4_4_ = 0;
  fread((void *)((long)&i + 4),4,1,pFStack_20);
  sh.expval = (OASIS_FLOAT)(i._4_4_ & 0x3000000);
  if (sh.expval == 3.761582e-37) {
    sh.expval = (OASIS_FLOAT)(i._4_4_ & 0xffffff);
    if (sh.expval == 1.4013e-45) {
      sh.summary_id = 0;
      _summary_set = fread(&this->samplesize_,4,1,pFStack_20);
      if (_summary_set != 0) {
        _summary_set = fread(&sh.summary_id,4,1,pFStack_20);
      }
      printf("event_id,period_no,summary_id,sidx,loss\n");
      sr.sidx = 0;
      while (_summary_set != 0) {
        _summary_set = fread(&sr.loss,0xc,1,pFStack_20);
        while (((_summary_set != 0 &&
                (_summary_set = fread(&p_iter,8,1,pFStack_20), _summary_set != 0)) &&
               ((uint)p_iter._M_current != 0))) {
          pmVar4 = std::
                   map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::operator[](&this->event_to_period_,(key_type *)&sr.loss);
          local_58._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pmVar4);
          while( true ) {
            pmVar4 = std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[](&this->event_to_period_,(key_type *)&sr.loss);
            local_60._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(pmVar4);
            bVar2 = __gnu_cxx::operator!=(&local_58,&local_60);
            OVar1 = sr.loss;
            if (!bVar2) break;
            puVar5 = (uint *)__gnu_cxx::
                             __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                             operator*(&local_58);
            printf("%d,%d,%d,%d,%f\n",(double)p_iter._M_current._4_4_,(ulong)(uint)OVar1,
                   (ulong)*puVar5,(ulong)(uint)j,(ulong)(uint)p_iter._M_current);
          }
        }
        sr.sidx = sr.sidx + 1;
      }
    }
    fclose(pFStack_20);
    return;
  }
  fprintf(_stderr,"FATAL:%s: Not a summarycalc stream type %d\n","debug_process_summaryfile",
          (ulong)(uint)sh.expval);
  exit(-1);
}

Assistant:

void aalcalc::debug_process_summaryfile(const std::string &filename)
{
	FILE *fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	int summarycalcstream_type = 0;
	size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
	int stream_type = summarycalcstream_type & summarycalc_id;

	if (stream_type != summarycalc_id) {
		fprintf(stderr, "FATAL:%s: Not a summarycalc stream type %d\n", __func__, stream_type);
		exit(-1);
	}
	stream_type = streamno_mask & summarycalcstream_type;

	if (stream_type == 1) {
		int summary_set = 0;
		i = fread(&samplesize_, sizeof(samplesize_), 1, fin);
		if (i != 0) i = fread(&summary_set, sizeof(summary_set), 1, fin);
		printf("event_id,period_no,summary_id,sidx,loss\n");
		summarySampleslevelHeader sh;
		int j = 0;
		while (i != 0) {
			i = fread(&sh, sizeof(sh), 1, fin);
			while (i != 0) {
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, fin);
				if (i == 0) break;
				if (sr.sidx == 0) break;
				auto p_iter = event_to_period_[sh.event_id].begin();
				while (p_iter != event_to_period_[sh.event_id].end()) {
					printf("%d,%d,%d,%d,%f\n", sh.event_id, *p_iter, sh.summary_id, sr.sidx, sr.loss);
				}

			}
			j++;
		}		
	}

	fclose(fin);
}